

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo.cpp
# Opt level: O1

void demo2(void)

{
  IMLE<1,_1,_FastLinearExpert> imleObj;
  string local_430;
  Param local_410;
  IMLE<1,_1,_FastLinearExpert> local_378;
  
  IMLE<1,_1,_FastLinearExpert>::Param::Param(&local_410);
  local_410.Psi0.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
        (DenseStorage<double,_1,_1,_1,_0>)0x3fb999999999999a;
  local_410.sigma0 = 1.0;
  local_410.p0 = 0.2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t --- Param constructor: ---",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  IMLE<1,_1,_FastLinearExpert>::IMLE(&local_378,&local_410,0x800);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"cos1D.xml","");
  IMLE<1,_1,_FastLinearExpert>::createDefaultParamFile(&local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  cos1D_testSaveLoadAndParamHandling<IMLE<1,1,FastLinearExpert>>(&local_378);
  IMLE<1,_1,_FastLinearExpert>::~IMLE(&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.defaultSave._M_dataplus._M_p != &local_410.defaultSave.field_2) {
    operator_delete(local_410.defaultSave._M_dataplus._M_p);
  }
  return;
}

Assistant:

void demo2()
{
    const int d = 1;    //Input dimension
    const int D = 1;    //Output dimension

    //      IMLE Parameters
    IMLE<d,D>::Param param;
    param.Psi0 = IMLE<d,D>::X::Constant(0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.2;

    // Param constructor:
    cout << "\t --- Param constructor: ---" << endl;
    IMLE<d,D> imleObj(param);

    // Default Param File:
    IMLE<d,D>::createDefaultParamFile("cos1D.xml");

    cos1D_testSaveLoadAndParamHandling(imleObj );
}